

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::mark_packable_structs(CompilerMSL *this)

{
  ParsedIR *this_00;
  uint uVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  size_t sVar3;
  bool bVar4;
  SPIRVariable *var;
  SPIRType *pSVar5;
  long lVar6;
  LoopLock loop_lock;
  
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  lVar6 = 0;
  do {
    if (sVar3 << 2 == lVar6) {
      ParsedIR::LoopLock::~LoopLock(&loop_lock);
      ParsedIR::create_loop_hard_lock(this_00);
      pTVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[1].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
      for (lVar6 = 0; sVar3 << 2 != lVar6; lVar6 = lVar6 + 4) {
        uVar1 = *(uint *)((long)&pTVar2->id + lVar6);
        if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
            ptr[uVar1].type == TypeType) {
          pSVar5 = ParsedIR::get<spirv_cross::SPIRType>(this_00,uVar1);
          if (((pSVar5->basetype == Struct) && (pSVar5->pointer == true)) &&
             (pSVar5->storage == StorageClassPhysicalStorageBuffer)) {
            mark_as_packable(this,pSVar5);
          }
        }
      }
      ParsedIR::LoopLock::~LoopLock(&loop_lock);
      return;
    }
    uVar1 = *(uint *)((long)&pTVar2->id + lVar6);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [uVar1].type == TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,uVar1);
      if (var->storage != StorageClassFunction) {
        bVar4 = Compiler::is_hidden_variable((Compiler *)this,var,false);
        if (!bVar4) {
          pSVar5 = Compiler::get<spirv_cross::SPIRType>
                             ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
          if (((pSVar5->pointer == true) &&
              (pSVar5->storage < (StorageClassStorageBuffer|StorageClassInput))) &&
             ((0x1205U >> (pSVar5->storage & 0x1f) & 1) != 0)) {
            bVar4 = Compiler::has_decoration
                              ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,DecorationBlock
                              );
            if (!bVar4) {
              bVar4 = Compiler::has_decoration
                                ((Compiler *)this,(ID)(pSVar5->super_IVariant).self.id,
                                 DecorationBufferBlock);
              if (!bVar4) goto LAB_0019abd6;
            }
            mark_as_packable(this,pSVar5);
          }
        }
LAB_0019abd6:
        if (var->storage == StorageClassWorkgroup) {
          pSVar5 = Compiler::get<spirv_cross::SPIRType>
                             ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
          if (pSVar5->basetype == Struct) {
            mark_as_workgroup_struct(this,pSVar5);
          }
        }
      }
    }
    lVar6 = lVar6 + 4;
  } while( true );
}

Assistant:

void CompilerMSL::mark_packable_structs()
{
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (var.storage != StorageClassFunction && !is_hidden_variable(var))
		{
			auto &type = this->get<SPIRType>(var.basetype);
			if (type.pointer &&
			    (type.storage == StorageClassUniform || type.storage == StorageClassUniformConstant ||
			     type.storage == StorageClassPushConstant || type.storage == StorageClassStorageBuffer) &&
			    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
				mark_as_packable(type);
		}

		if (var.storage == StorageClassWorkgroup)
		{
			auto *type = &this->get<SPIRType>(var.basetype);
			if (type->basetype == SPIRType::Struct)
				mark_as_workgroup_struct(*type);
		}
	});

	// Physical storage buffer pointers can appear outside of the context of a variable, if the address
	// is calculated from a ulong or uvec2 and cast to a pointer, so check if they need to be packed too.
	ir.for_each_typed_id<SPIRType>([&](uint32_t, SPIRType &type) {
		if (type.basetype == SPIRType::Struct && type.pointer && type.storage == StorageClassPhysicalStorageBuffer)
			mark_as_packable(type);
	});
}